

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzhierarquicalgrid.cpp
# Opt level: O1

TPZGeoMesh * __thiscall
TPZHierarquicalGrid::ComputeExtrusion(TPZHierarquicalGrid *this,REAL t,REAL dt,int n)

{
  double dVar1;
  TPZFunction<double> *pTVar2;
  int eldim;
  TPZGeoMesh *pTVar3;
  TPZGeoNode *pTVar4;
  TPZGeoNode *this_00;
  TPZGeoEl **ppTVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  int elid;
  TPZVec<double> Coordinates;
  TPZVec<double> NewCoordinates;
  TPZVec<double> NewCoordinates_r;
  ulong local_130;
  long local_128;
  TPZVec<double> local_110;
  ulong local_f0;
  ulong local_e8;
  REAL local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  double local_b8;
  double local_b0;
  TPZVec<double> local_a8;
  TPZVec<double> local_88;
  double local_68;
  ulong uStack_60;
  TPZVec<double> local_50;
  
  uVar9 = n + 1;
  local_e0 = t;
  TPZVec<TPZAutoPointer<TPZGeoMesh>_>::Resize(&this->fSubBases,(long)(int)uVar9);
  pTVar3 = (TPZGeoMesh *)operator_new(0x2a8);
  TPZGeoMesh::TPZGeoMesh(pTVar3);
  this->fComputedGeomesh = pTVar3;
  uVar7 = (((this->fBase).fRef)->fPointer->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>.fNElements
  ;
  TPZAdmChunkVector<TPZGeoNode,_10>::Resize(&pTVar3->fNodeVec,uVar9 * (uint)uVar7);
  uVar6 = 0;
  if (-1 < n) {
    local_d8 = uVar7 & 0xffffffff;
    local_c8 = (ulong)((uint)uVar7 & 0x7fffffff);
    local_68 = 1.0;
    uStack_60 = 0;
    local_128 = 0;
    local_130 = 0;
    local_f0 = (ulong)(uint)n;
    local_e8 = uVar7;
    do {
      if (0 < (int)uVar7) {
        local_b8 = (double)(int)local_130 * dt + local_e0;
        uVar7 = 0;
        local_d0 = uVar6;
        local_c0 = uVar6;
        do {
          TPZVec<double>::TPZVec(&local_110,1);
          local_88._vptr_TPZVec = (_func_int **)0x0;
          TPZVec<double>::TPZVec(&local_50,3,(double *)&local_88);
          local_a8._vptr_TPZVec = (_func_int **)0x0;
          TPZVec<double>::TPZVec(&local_88,3,(double *)&local_a8);
          *local_110.fStore = local_b8;
          local_b0 = 0.0;
          TPZVec<double>::TPZVec(&local_a8,3,&local_b0);
          pTVar4 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                             (&(((this->fBase).fRef)->fPointer->fNodeVec).
                               super_TPZChunkVector<TPZGeoNode,_10>,uVar7);
          lVar8 = local_128 + uVar7;
          this_00 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                              (&(this->fComputedGeomesh->fNodeVec).
                                super_TPZChunkVector<TPZGeoNode,_10>,lVar8);
          TPZGeoNode::operator=(this_00,pTVar4);
          pTVar4 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                             (&(this->fComputedGeomesh->fNodeVec).
                               super_TPZChunkVector<TPZGeoNode,_10>,lVar8);
          TPZGeoNode::GetCoordinates(pTVar4,&local_a8);
          pTVar2 = ((this->fParametricFunction).fRef)->fPointer;
          (**(code **)((long)*pTVar2 + 0x60))(pTVar2,&local_110,&local_88);
          dVar1 = *local_88.fStore;
          *local_50.fStore = dVar1;
          local_50.fStore[1] = local_88.fStore[1];
          local_50.fStore[2] = local_88.fStore[2];
          if ((((local_130 & 1) == 0) || (this->fNonAffineQ != true)) ||
             (((this->fBase).fRef)->fPointer->fDim != 2)) {
            *local_a8.fStore = dVar1 + *local_a8.fStore;
            local_a8.fStore[1] = local_50.fStore[1] + local_a8.fStore[1];
            local_a8.fStore[2] = local_50.fStore[2] + local_a8.fStore[2];
          }
          else {
            *local_a8.fStore = dVar1 + *local_a8.fStore;
            local_a8.fStore[1] = local_50.fStore[1] + local_a8.fStore[1];
            local_a8.fStore[2] = local_68 * dt * 0.5 + local_50.fStore[2] + local_a8.fStore[2];
            local_68 = -local_68;
            uStack_60 = uStack_60 ^ 0x8000000000000000;
          }
          pTVar4 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                             (&(this->fComputedGeomesh->fNodeVec).
                               super_TPZChunkVector<TPZGeoNode,_10>,lVar8);
          TPZGeoNode::SetCoord(pTVar4,&local_a8);
          pTVar4 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                             (&(this->fComputedGeomesh->fNodeVec).
                               super_TPZChunkVector<TPZGeoNode,_10>,lVar8);
          pTVar4->fId = (int)local_c0 + (int)uVar7;
          local_a8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          if (local_a8.fStore != (double *)0x0) {
            operator_delete__(local_a8.fStore);
          }
          local_88._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          if (local_88.fStore != (double *)0x0) {
            operator_delete__(local_88.fStore);
          }
          local_50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          if (local_50.fStore != (double *)0x0) {
            operator_delete__(local_50.fStore);
          }
          local_110._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          if (local_110.fStore != (double *)0x0) {
            operator_delete__(local_110.fStore);
          }
          uVar7 = uVar7 + 1;
        } while (local_c8 != uVar7);
        uVar6 = (ulong)(uint)((int)local_d0 + (int)uVar7);
        uVar7 = local_e8;
      }
      local_130 = local_130 + 1;
      local_128 = local_128 + local_d8;
    } while (local_130 != uVar9);
    uVar6 = (ulong)(int)uVar6;
    n = (int)local_f0;
  }
  uVar7 = this->fComputedGeomesh->fNodeMaxId;
  if ((long)uVar6 < (long)uVar7) {
    uVar6 = uVar7;
  }
  this->fComputedGeomesh->fNodeMaxId = uVar6;
  local_110._vptr_TPZVec = (_func_int **)((ulong)local_110._vptr_TPZVec & 0xffffffff00000000);
  pTVar3 = ((this->fBase).fRef)->fPointer;
  if (0 < (pTVar3->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements) {
    lVar8 = 0;
    do {
      ppTVar5 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(pTVar3->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,lVar8);
      eldim = (**(code **)(*(long *)*ppTVar5 + 0x210))();
      ppTVar5 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(((this->fBase).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZGeoEl_*,_10>,lVar8);
      CreateGeometricElement(this,n,(int)lVar8,eldim,(*ppTVar5)->fMatId,(int *)&local_110);
      lVar8 = lVar8 + 1;
      pTVar3 = ((this->fBase).fRef)->fPointer;
    } while (lVar8 < (pTVar3->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements);
  }
  pTVar3 = this->fComputedGeomesh;
  lVar8 = (long)(int)local_110._vptr_TPZVec;
  if ((long)(int)local_110._vptr_TPZVec < pTVar3->fElementMaxId) {
    lVar8 = pTVar3->fElementMaxId;
  }
  pTVar3->fElementMaxId = lVar8;
  TPZGeoMesh::BuildConnectivity(pTVar3);
  return this->fComputedGeomesh;
}

Assistant:

TPZGeoMesh * TPZHierarquicalGrid::ComputeExtrusion(REAL t, REAL dt, int n)
{
    fSubBases.Resize(n+1);
    fComputedGeomesh = new TPZGeoMesh;
    int NNodesBase = fBase->NNodes();
    fComputedGeomesh->NodeVec().Resize( (n+1) * NNodesBase);
    
    // Creating new elements
    int nodeId = 0;
    REAL sing = 1.0;
    for(int il = 0; il < (n+1); il++ )
    {
        // copying l extrusions
        // For a while all of them are equal
        //        fSubBases[il] = new TPZGeoMesh(fBase);
        
        for(int inode = 0; inode < NNodesBase; inode++)
        {
            TPZVec<REAL> tpara(1),NewCoordinates_r(3,0.0);
            TPZVec<REAL> NewCoordinates(3,0.0);
            tpara[0] = dt*il+t;
            
            TPZVec<REAL> Coordinates(3,0.0);
            fComputedGeomesh->NodeVec()[inode + il * NNodesBase] =  fBase->NodeVec()[inode];
            //            NewGeomesh->NodeVec()[inode + il*fBase->NNodes()] =  fSubBases[il]->NodeVec()[inode];
            fComputedGeomesh->NodeVec()[inode + il * NNodesBase].GetCoordinates(Coordinates);
            
            fParametricFunction->Execute(tpara,NewCoordinates);
            NewCoordinates_r[0] = REAL(NewCoordinates[0]);
            NewCoordinates_r[1] = REAL(NewCoordinates[1]);
            NewCoordinates_r[2] = REAL(NewCoordinates[2]);
            
            if(((il+1)%2==0 && fNonAffineQ) && fBase->Dimension() == 2){
                Coordinates[0]+=NewCoordinates_r[0];
                Coordinates[1]+=NewCoordinates_r[1];
                Coordinates[2]+=NewCoordinates_r[2];
                Coordinates[2]+= sing*dt/2.0;
                sing *= -1.0;
            }
            else{
                Coordinates[0]+=NewCoordinates_r[0];
                Coordinates[1]+=NewCoordinates_r[1];
                Coordinates[2]+=NewCoordinates_r[2];
            }
            
            fComputedGeomesh->NodeVec()[inode + il * NNodesBase].SetCoord(Coordinates);
            fComputedGeomesh->NodeVec()[inode + il * NNodesBase].SetNodeId(nodeId);
            nodeId++;
        }
    }
    
    fComputedGeomesh->SetMaxNodeId(nodeId);
    
//    int fbasedim = fBase->Dimension();
    
    int elid=0;
    for(int iel = 0; iel < fBase->NElements(); iel++)
    {
        int ielDim      = fBase->ElementVec()[iel]->Dimension();
        int ielMatId    = fBase->ElementVec()[iel]->MaterialId();
        CreateGeometricElement(n,iel,ielDim,ielMatId,elid);
    }
    
    fComputedGeomesh->SetMaxElementId(elid);
    fComputedGeomesh->BuildConnectivity();
    return fComputedGeomesh;
    
}